

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_test.cc
# Opt level: O3

void TestSerialize<asn1_string_st*,asn1_string_st_const*>
               (asn1_string_st *obj,_func_int_asn1_string_st_ptr_uint8_t_ptr_ptr *i2d_func,
               Span<const_unsigned_char> expected)

{
  void *pvVar1;
  char *pcVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  int len;
  uint8_t *ptr;
  undefined1 local_80 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  Bytes local_70;
  undefined1 local_60 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  pointer local_50;
  int local_44;
  Bytes local_40;
  AssertHelperData *local_30;
  
  local_30 = (AssertHelperData *)0x0;
  local_44 = (*i2d_func)(obj,(uint8_t **)&local_30);
  local_80 = (undefined1  [8])((ulong)(uint)local_80._4_4_ << 0x20);
  testing::internal::CmpHelperGT<int,int>((internal *)local_60,"len","0",&local_44,(int *)local_80);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_80);
    if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_58->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
               ,0x39,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)local_80);
LAB_001e3080:
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    if (local_80 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_80 + 8))();
    }
    if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_58,local_58);
    }
    return;
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
  local_70.span_.size_ = (size_t)local_44;
  local_70.span_.data_ = (uchar *)local_30;
  local_80 = (undefined1  [8])expected.data_;
  local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)expected.size_;
  testing::internal::CmpHelperEQ<Bytes,Bytes>
            ((internal *)local_60,"Bytes(expected)","Bytes(ptr, len)",(Bytes *)local_80,&local_70);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_80);
    if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_58->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
               ,0x3a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    if (local_80 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_80 + 8))();
    }
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
  OPENSSL_free(local_30);
  local_44 = (*i2d_func)(obj,(uint8_t **)0x0);
  local_80 = (undefined1  [8])((ulong)local_80 & 0xffffffff00000000);
  testing::internal::CmpHelperGT<int,int>((internal *)local_60,"len","0",&local_44,(int *)local_80);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_80);
    if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_58->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
               ,0x3e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)local_80);
    goto LAB_001e3080;
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
  local_80._0_4_ = (int)expected.size_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_60,"len","static_cast<int>(expected.size())",&local_44,
             (int *)local_80);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_80);
    if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_58->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
               ,0x3f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    if (local_80 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_80 + 8))();
    }
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60,(long)local_44,
             (allocator_type *)local_80);
  local_44 = (*i2d_func)(obj,(uint8_t **)&local_30);
  local_70.span_.data_ = (uchar *)CONCAT44(local_70.span_.data_._4_4_,(int)expected.size_);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_80,"len","static_cast<int>(expected.size())",&local_44,
             (int *)&local_70);
  if (local_80[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)&local_70);
    if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_78->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_40,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
               ,0x44,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_40,(Message *)&local_70);
  }
  else {
    if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_78,local_78);
    }
    local_70.span_.data_ = (uchar *)local_58;
    testing::internal::CmpHelperEQ<unsigned_char*,unsigned_char*>
              ((internal *)local_80,"ptr","buf.data() + buf.size()",(uchar **)&local_30,
               (uchar **)&local_70);
    if (local_80[0] == (allocator_type)0x0) {
      testing::Message::Message((Message *)&local_70);
      if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = (local_78->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_40,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0x45,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_40,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_40);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70.span_.data_
          != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(((_Alloc_hider *)local_70.span_.data_)->_M_p + 8))();
      }
    }
    if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_78,local_78);
    }
    local_40.span_.size_ = (long)local_58 - CONCAT71(local_60._1_7_,local_60[0]);
    local_70.span_.data_ = expected.data_;
    local_70.span_.size_ = expected.size_;
    testing::internal::CmpHelperEQ<Bytes,Bytes>
              ((internal *)local_80,"Bytes(expected)","Bytes(buf)",&local_70,&local_40);
    if (local_80[0] != (allocator_type)0x0) goto LAB_001e3323;
    testing::Message::Message((Message *)&local_70);
    if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_78->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
               ,0x46,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_40,(Message *)&local_70);
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_40);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_70.span_.data_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_70.span_.data_ + 8))();
  }
LAB_001e3323:
  if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78,local_78);
  }
  pvVar1 = (void *)CONCAT71(local_60._1_7_,local_60[0]);
  if (pvVar1 == (void *)0x0) {
    return;
  }
  operator_delete(pvVar1,(long)local_50 - (long)pvVar1);
  return;
}

Assistant:

void TestSerialize(T obj, int (*i2d_func)(U a, uint8_t **pp),
                   bssl::Span<const uint8_t> expected) {
  static_assert(std::is_convertible<T, U>::value,
                "incompatible parameter to i2d_func");
  // Test the allocating version first. It is easiest to debug.
  uint8_t *ptr = nullptr;
  int len = i2d_func(obj, &ptr);
  ASSERT_GT(len, 0);
  EXPECT_EQ(Bytes(expected), Bytes(ptr, len));
  OPENSSL_free(ptr);

  len = i2d_func(obj, nullptr);
  ASSERT_GT(len, 0);
  EXPECT_EQ(len, static_cast<int>(expected.size()));

  std::vector<uint8_t> buf(len);
  ptr = buf.data();
  len = i2d_func(obj, &ptr);
  ASSERT_EQ(len, static_cast<int>(expected.size()));
  EXPECT_EQ(ptr, buf.data() + buf.size());
  EXPECT_EQ(Bytes(expected), Bytes(buf));
}